

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_pax_xattr_schily.c
# Opt level: O3

void test_read_pax_xattr_schily(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  archive_entry *ae;
  size_t xsize;
  void *xval;
  char *xname;
  archive_entry *local_50;
  int local_48 [2];
  char *local_40;
  char *local_38;
  
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                   ,L')',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                      ,L'*',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                      ,L'+',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  extract_reference_file("test_read_pax_xattr_schily.tar");
  wVar2 = archive_read_open_filename(a,"test_read_pax_xattr_schily.tar",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                      ,L'/',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                      ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)0x0);
  wVar2 = archive_entry_xattr_count(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                      ,L'2',2,"2",(long)wVar2,"archive_entry_xattr_count(ae)",(void *)0x0);
  wVar2 = archive_entry_xattr_reset(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                      ,L'3',2,"2",(long)wVar2,"archive_entry_xattr_reset(ae)",(void *)0x0);
  wVar2 = archive_entry_xattr_next(local_50,&local_38,&local_40,(size_t *)local_48);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                      ,L'5',0,"0",(long)wVar2,"archive_entry_xattr_next(ae, &xname, &xval, &xsize)",
                      (void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
             ,L'6',local_38,"xname","security.selinux","\"security.selinux\"",(void *)0x0,L'\0');
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
             ,L'8',local_40,"xval","system_u:object_r:unlabeled_t:s0","string",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                      ,L':',(long)local_48[0],"(int)xsize",0x21,"strlen(string) + 1",(void *)0x0);
  wVar2 = archive_entry_xattr_next(local_50,&local_38,&local_40,(size_t *)local_48);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                      ,L'<',0,"0",(long)wVar2,"archive_entry_xattr_next(ae, &xname, &xval, &xsize)",
                      (void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
             ,L'=',local_38,"xname","security.ima","\"security.ima\"",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                      ,L'>',(long)local_48[0],"(int)xsize",0x109,"265",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                      ,L'A',local_40,"xval",anon_var_dwarf_dbc0d,"array",0xc,"12",(void *)0x0);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                      ,L'D',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_pax_xattr_schily.c"
                      ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_pax_xattr_schily)
{
	struct archive *a;
	struct archive_entry *ae;
	const char *refname = "test_read_pax_xattr_schily.tar";
	const char *xname; /* For xattr tests. */
	const void *xval; /* For xattr tests. */
	size_t xsize; /* For xattr tests. */
	const char *string, *array;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));

	extract_reference_file(refname);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	assertEqualInt(ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_xattr_count(ae));
	assertEqualInt(2, archive_entry_xattr_reset(ae));

	assertEqualInt(0, archive_entry_xattr_next(ae, &xname, &xval, &xsize));
	assertEqualString(xname, "security.selinux");
	string = "system_u:object_r:unlabeled_t:s0";
	assertEqualString(xval, string);
	/* the xattr's value also contains the terminating \0 */
	assertEqualInt((int)xsize, strlen(string) + 1);

	assertEqualInt(0, archive_entry_xattr_next(ae, &xname, &xval, &xsize));
	assertEqualString(xname, "security.ima");
	assertEqualInt((int)xsize, 265);
	/* we only compare the first 12 bytes */
	array = "\x03\x02\x04\xb0\xe9\xd6\x79\x01\x00\x2b\xad\x1e";
	assertEqualMem(xval, array, 12);

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}